

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gchtfind.c
# Opt level: O0

LispPTR htfind(LispPTR ptr,int casep)

{
  LispPTR LVar1;
  uint uVar2;
  LispPTR *entry_00;
  LispPTR *pLVar3;
  LispPTR *pLVar4;
  uint uVar5;
  LispPTR linkoff_2;
  LispPTR linkoff_1;
  LispPTR linkoff;
  LispPTR hiptr;
  LispPTR entry_contents;
  LispPTR *prev;
  LispPTR *link;
  LispPTR *entry;
  int casep_local;
  LispPTR ptr_local;
  
  uVar2 = ptr >> 0xf & 0x1ffe;
  entry_00 = HTmain + ((ptr & 0xffff) >> 1);
  linkoff = *entry_00;
  if (linkoff == 0) {
    if (casep == 0) {
      *entry_00 = uVar2 | 0x40000;
      LVar1 = *Reclaim_cnt_word;
      *Reclaim_cnt_word = LVar1 - 1;
      if (LVar1 - 1 < 0xe0001) {
        MachineState.irqend = 0;
        MachineState.irqcheck = 0;
        *Reclaim_cnt_word = 0xe0000;
      }
      return 0;
    }
    if (casep != 1) {
      error("GC error: new entry touches stack bit");
      return 0;
    }
    *entry_00 = uVar2;
    LVar1 = *Reclaim_cnt_word;
    *Reclaim_cnt_word = LVar1 - 1;
    if (0xe0000 < LVar1 - 1) {
      return ptr;
    }
    MachineState.irqend = 0;
    MachineState.irqcheck = 0;
    *Reclaim_cnt_word = 0xe0000;
    return ptr;
  }
  if ((linkoff & 1) == 0) {
    if (uVar2 != (linkoff & 0x1ffe)) {
      uVar5 = *HTcoll;
      if (uVar5 == 0) {
        uVar5 = HTcoll[1];
        if (0x7ffef < uVar5) {
          disablegc1(0);
          return 0;
        }
        HTcoll[1] = uVar5 + 2;
        prev = HTcoll + uVar5;
      }
      else {
        *HTcoll = HTcoll[(ulong)uVar5 + 1];
        prev = HTcoll + uVar5;
      }
      uVar5 = *HTcoll;
      if (uVar5 == 0) {
        uVar5 = HTcoll[1];
        if (0x7ffef < uVar5) {
          disablegc1(0);
          return 0;
        }
        HTcoll[1] = uVar5 + 2;
        _hiptr = HTcoll + uVar5;
      }
      else {
        *HTcoll = HTcoll[(ulong)uVar5 + 1];
        _hiptr = HTcoll + uVar5;
      }
      _hiptr[1] = 0;
      *_hiptr = linkoff;
      prev[1] = (LispPTR)((long)_hiptr - (long)HTcoll >> 2);
      *entry_00 = (int)((long)prev - (long)HTcoll >> 2) + 1;
      if (casep == 0) {
        *prev = uVar2 | 0x40000;
        LVar1 = *Reclaim_cnt_word;
        *Reclaim_cnt_word = LVar1 - 1;
        if (LVar1 - 1 < 0xe0001) {
          MachineState.irqend = 0;
          MachineState.irqcheck = 0;
          *Reclaim_cnt_word = 0xe0000;
        }
        return 0;
      }
      if (casep != 1) {
        error("GC error: new entry touches stack bit");
        return 0;
      }
      *prev = uVar2;
      LVar1 = *Reclaim_cnt_word;
      *Reclaim_cnt_word = LVar1 - 1;
      if (0xe0000 < LVar1 - 1) {
        return ptr;
      }
      MachineState.irqend = 0;
      MachineState.irqcheck = 0;
      *Reclaim_cnt_word = 0xe0000;
      return ptr;
    }
    if ((linkoff & 0xfffe0000) == 0xfffe0000) {
      modify_big_reference_count(entry_00,(DLword)casep,ptr);
      return 0;
    }
    if (casep == 0) {
      linkoff = linkoff + 0x20000;
      if ((linkoff & 0xfffe0000) == 0xfffe0000) {
        *entry_00 = linkoff;
        enter_big_reference_count(ptr);
        return 0;
      }
      if ((linkoff & 0xffff0000) == 0x20000) {
        *Reclaim_cnt_word = *Reclaim_cnt_word + 1;
LAB_0013a4bf:
        *entry_00 = 0;
        return 0;
      }
    }
    else if (casep == 1) {
      if (linkoff >> 0x11 == 0) {
        error("attempt to decrement 0 reference count");
      }
      linkoff = linkoff - 0x20000;
      if ((linkoff & 0xffff0000) == 0x20000) {
        *Reclaim_cnt_word = *Reclaim_cnt_word + 1;
        goto LAB_0013a4bf;
      }
    }
    else {
      error("GC error: mod entry touches stack bit");
    }
    *entry_00 = linkoff;
    return 0;
  }
  uVar5 = linkoff - 1;
  _hiptr = (LispPTR *)0x0;
  while( true ) {
    prev = HTcoll + uVar5;
    linkoff = *prev;
    if (uVar2 == (linkoff & 0x1ffe)) break;
    uVar5 = prev[1];
    if (uVar5 == 0) {
      uVar5 = *HTcoll;
      if (uVar5 == 0) {
        uVar5 = HTcoll[1];
        if (0x7ffef < uVar5) {
          disablegc1(0);
          return 0;
        }
        HTcoll[1] = uVar5 + 2;
        prev = HTcoll + uVar5;
      }
      else {
        *HTcoll = HTcoll[(ulong)uVar5 + 1];
        prev = HTcoll + uVar5;
      }
      prev[1] = *entry_00 - 1;
      *entry_00 = (int)((long)prev - (long)HTcoll >> 2) + 1;
      if (casep == 0) {
        *prev = uVar2 | 0x40000;
        LVar1 = *Reclaim_cnt_word;
        *Reclaim_cnt_word = LVar1 - 1;
        if (LVar1 - 1 < 0xe0001) {
          MachineState.irqend = 0;
          MachineState.irqcheck = 0;
          *Reclaim_cnt_word = 0xe0000;
        }
        return 0;
      }
      if (casep != 1) {
        error("GC error: new entry touches stack bit");
        return 0;
      }
      *prev = uVar2;
      LVar1 = *Reclaim_cnt_word;
      *Reclaim_cnt_word = LVar1 - 1;
      if (0xe0000 < LVar1 - 1) {
        return ptr;
      }
      MachineState.irqend = 0;
      MachineState.irqcheck = 0;
      *Reclaim_cnt_word = 0xe0000;
      return ptr;
    }
    _hiptr = prev;
  }
  if ((linkoff & 0xfffe0000) == 0xfffe0000) {
    modify_big_reference_count(prev,(DLword)casep,ptr);
    return 0;
  }
  if (casep == 0) {
    linkoff = linkoff + 0x20000;
    if ((linkoff & 0xfffe0000) == 0xfffe0000) {
      *prev = linkoff;
      enter_big_reference_count(ptr);
      return 0;
    }
    if ((linkoff & 0xffff0000) == 0x20000) {
      *Reclaim_cnt_word = *Reclaim_cnt_word + 1;
LAB_0013a63d:
      if (_hiptr == (LispPTR *)0x0) {
        *entry_00 = prev[1] | 1;
      }
      else {
        _hiptr[1] = prev[1];
      }
      *prev = 0;
      prev[1] = *HTcoll;
      *HTcoll = (LispPTR)((long)prev - (long)HTcoll >> 2);
      pLVar3 = HTcoll + *entry_00;
      pLVar4 = pLVar3 + -1;
      if (*pLVar3 == 0) {
        *entry_00 = *pLVar4;
        *pLVar4 = 0;
        *pLVar3 = *HTcoll;
        *HTcoll = (LispPTR)((long)pLVar4 - (long)HTcoll >> 2);
      }
      return 0;
    }
  }
  else if (casep == 1) {
    if (linkoff >> 0x11 == 0) {
      error("attempt to decrement 0 reference count");
    }
    linkoff = linkoff - 0x20000;
    if ((linkoff & 0xffff0000) == 0x20000) {
      *Reclaim_cnt_word = *Reclaim_cnt_word + 1;
      goto LAB_0013a63d;
    }
  }
  else {
    error("GC error: mod entry touches stack bit");
  }
  *prev = linkoff;
  return 0;
}

Assistant:

LispPTR htfind(LispPTR ptr, int casep) {
  GCENTRY *entry, *link, *prev;
  GCENTRY entry_contents, hiptr;

  /* if the NOREF bit is on in the type table entry, do
  not reference count this pointer. Used for non-reference
  counted types like symbols, and also when the GC is
  disabled. */

  /*
   * Following two tests were moved into GCLOOKUP macro
   * for efficiency.
   */
  /*
      if (GetTypeEntry(ptr) & TT_NOREF) return NIL;
  */
  /* if *GcDisabled_word is T then do nothing */
  /* FS:  this test should not be needed (because type table should
          be cleared).  Also, this test seems to cause an infinite
          ucode loop in remimplicitkeyhash on the 386i		*/

  /*    if(*GcDisabled_word == ATOM_T) return(NIL); */

  /* GC hash table entries have the high 8 bits of the
  pointer stored in the middle. Set up hiptr to have
  the high bits of the pointer ready to store or test
  against */

  hiptr = (((UNSIGNED)ptr) >> (16 - HTHISHIFT)) & HTHIMASK;

  /* entry points at the place in the main hash table
  where this pointer is stored. The 'hash' isn't one really;
  it just uses the low bits of the pointer. */

  entry = HTmain + (LOLOC(ptr) >> 1);

  entry_contents = GETGC(entry);

  if (entry_contents == 0) NewEntry(entry, hiptr, casep, ptr);
  /* NewEntry returns */

  if (entry_contents & 1) { /* low bit means a collision entry */
    /* entry_contents-1 removes low bit */
    link = HTcoll + (entry_contents - 1);
    prev = 0;
    goto newlink;
  }

  if (hiptr == (entry_contents & HTHIMASK)) {
    ModEntry(entry, entry_contents, ptr, casep, delentry);
    /* ModEntry returns or will go to delentry */
  }

  /* new collision */

  GetLink(link);
  GetLink(prev);
  GETGC((GCENTRY *)prev + 1) = 0;
  GETGC((GCENTRY *)prev) = entry_contents;
  GETGC((GCENTRY *)link + 1) = prev - HTcoll;
  GETGC((GCENTRY *)entry) = (link - HTcoll) + 1;

  NewEntry(link, hiptr, casep, ptr);
/* NewEntry returns */

delentry:
  GETGC(entry) = 0;
  return NIL;

/* start here when a collision is detected. link is a pointer to
  the entry in the collision table, prev is the previous collision
  entry or 0 if this is the first one. */

newlink:
  entry_contents = GETGC(link);
  if (hiptr == (entry_contents & HTHIMASK)) {
    ModEntry(link, entry_contents, ptr, casep, dellink);
    /* ModEntry returns or goes to dellink */
  }

  /* collision didn't match  */
  entry_contents = GETGC((GCENTRY *)link + 1);
  if (entry_contents == 0) goto nolink;

  /* try the next link in the collision table */
  prev = link;
  link = HTcoll + entry_contents;
  goto newlink;

dellink:
  if (prev)
    GETGC((GCENTRY *)prev + 1) = GETGC((GCENTRY *)link + 1);
  else
    GETGC((GCENTRY *)entry) = (GETGC((GCENTRY *)link + 1)) | 1;
  FreeLink(link);
  link = HTcoll + (GETGC((GCENTRY *)entry)) - 1;
  if (GETGC(link + 1) == 0) {
    GETGC((GCENTRY *)entry) = GETGC((GCENTRY *)link);
    FreeLink(link);
  }
  return NIL;

nolink: /* no match */

  GetLink(link);
  GETGC((GCENTRY *)link + 1) = GETGC((GCENTRY *)entry) - 1;
  GETGC((GCENTRY *)entry) = (link - HTcoll) + 1;
  NewEntry(link, hiptr, casep, ptr);
  /* NewEntry will return */
}